

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::RunConfigurationDashboard(cmCTestScriptHandler *this)

{
  string *filename;
  cmCTest *pcVar1;
  pointer pcVar2;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  ostream *poVar6;
  Status SVar7;
  undefined8 uVar8;
  int iVar9;
  pointer pbVar10;
  string_view arg;
  int retVal;
  undefined4 local_4bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ctestCommands;
  string output;
  string command;
  string cmakeFailedOuput;
  char *local_430 [4];
  ostringstream cmCTestLog_msg_3;
  ostringstream cmCTestLog_msg;
  byte abStack_278 [584];
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  uVar8 = 0;
  command.field_2._M_local_buf[0] = '\0';
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retVal = CheckOutSourceDir(this);
  iVar9 = retVal;
  if ((retVal == 0) && (retVal = BackupDirectories(this), iVar9 = retVal, retVal == 0)) {
    if ((this->EmptyBinDir == true) && (bVar3 = EmptyBinaryDirectory(&this->BinaryDir), !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem removing the binary directory");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      uVar8 = 0x2a6;
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x2a6,_cmCTestLog_msg_3,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    filename = &this->BinaryDir;
    bVar3 = cmsys::SystemTools::FileExists(filename);
    if (((bVar3) || (bVar3 = std::operator!=(&this->SourceDir,filename), !bVar3)) ||
       (SVar7 = cmsys::SystemTools::MakeDirectory(filename,(mode_t *)0x0), SVar7.Kind_ == Success))
    {
      if ((this->EmptyBinDir == true) && (_Var4 = std::operator==(&this->SourceDir,filename), _Var4)
         ) {
        if ((this->CVSCheckOut)._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg,
                     "You have specified the source and binary directories to be the same (an in source build). You have also specified that the binary directory is to be erased. This means that the source will have to be checked out from CVS. But you have not specified CTEST_CVS_CHECKOUT"
                     ,(allocator<char> *)&cmCTestLog_msg_3);
          cmSystemTools::Error((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          iVar9 = 8;
          goto LAB_0048b32c;
        }
        retVal = CheckOutSourceDir(this);
        if (retVal != 0) {
          RestoreBackupDirectories(this);
          iVar9 = retVal;
          goto LAB_0048b32c;
        }
      }
      PerformExtraUpdates(this);
      retVal = 0;
      if (((this->InitialCache)._M_string_length == 0) ||
         (bVar3 = WriteInitialCache(filename,&this->InitialCache), bVar3)) {
        cmakeFailedOuput._M_dataplus._M_p = (pointer)&cmakeFailedOuput.field_2;
        cmakeFailedOuput._M_string_length = 0;
        cmakeFailedOuput.field_2._M_local_buf[0] = '\0';
        pcVar2 = (pointer)(this->CMakeCmd)._M_string_length;
        local_4bc = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        if (pcVar2 != (pointer)0x0) {
          _cmCTestLog_msg_3 = (char *)0x2;
          _cmCTestLog_msg = pcVar2;
          cmStrCat<std::__cxx11::string>
                    ((string *)&ctestCommands,(cmAlphaNum *)&cmCTestLog_msg,
                     (cmAlphaNum *)&cmCTestLog_msg_3,&this->SourceDir);
          std::__cxx11::string::operator=((string *)&command,(string *)&ctestCommands);
          std::__cxx11::string::~string((string *)&ctestCommands);
          output._M_string_length = 0;
          *output._M_dataplus._M_p = '\0';
          std::__cxx11::string::append((char *)&command);
          retVal = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Run cmake command: ");
          poVar6 = std::operator<<(poVar6,(string *)&command);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x2e4,_cmCTestLog_msg_3,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          bVar3 = cmSystemTools::RunSingleCommand
                            (&command,&output,&output,&retVal,(this->BinaryDir)._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
          if ((this->CMOutFile)._M_string_length != 0) {
            std::__cxx11::string::string((string *)&ctestCommands,(string *)&this->CMOutFile);
            bVar5 = cmsys::SystemTools::FileIsFullPath((string *)&ctestCommands);
            if (!bVar5) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmCTestLog_msg_3,filename,"/");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmCTestLog_msg,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmCTestLog_msg_3,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ctestCommands);
              std::__cxx11::string::operator=((string *)&ctestCommands,(string *)&cmCTestLog_msg);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Write CMake output to file: ");
            poVar6 = std::operator<<(poVar6,(string *)&ctestCommands);
            std::endl<char,std::char_traits<char>>(poVar6);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                         ,0x2f1,_cmCTestLog_msg_3,false);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)&cmCTestLog_msg,(string *)&ctestCommands,false,None)
            ;
            if ((abStack_278[*(long *)(_cmCTestLog_msg + -0x18)] & 5) == 0) {
              std::operator<<((ostream *)&cmCTestLog_msg,output._M_dataplus._M_p);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
              poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,
                                       "Cannot open CMake output file: ");
              poVar6 = std::operator<<(poVar6,(string *)&ctestCommands);
              poVar6 = std::operator<<(poVar6," for writing");
              std::endl<char,std::char_traits<char>>(poVar6);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                           ,0x2f8,local_430[0],false);
              std::__cxx11::string::~string((string *)local_430);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
            }
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&ctestCommands);
          }
          if (!bVar3 || retVal != 0) {
            std::__cxx11::string::_M_assign((string *)&cmakeFailedOuput);
            local_4bc = 0;
          }
        }
        arg._M_str = (this->CTestCmd)._M_dataplus._M_p;
        arg._M_len = (this->CTestCmd)._M_string_length;
        cmExpandedList_abi_cxx11_(&ctestCommands,arg,false);
        pbVar10 = ctestCommands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pbVar10 ==
              ctestCommands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar9 = 0;
            if (this->Backup == true) {
              cmsys::SystemTools::RemoveADirectory(&this->BackupSourceDir);
              cmsys::SystemTools::RemoveADirectory(&this->BackupBinaryDir);
              iVar9 = 0;
            }
            goto LAB_0048b318;
          }
          std::__cxx11::string::_M_assign((string *)&command);
          output._M_string_length = 0;
          *output._M_dataplus._M_p = '\0';
          retVal = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Run ctest command: ");
          poVar6 = std::operator<<(poVar6,(string *)&command);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x30a,_cmCTestLog_msg_3,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          bVar3 = cmSystemTools::RunSingleCommand
                            (&command,&output,&output,&retVal,(this->BinaryDir)._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
          if (((byte)local_4bc & bVar3) != 1) goto LAB_0048b163;
          pbVar10 = pbVar10 + 1;
        } while ((retVal & 4U) == 0);
        bVar3 = true;
LAB_0048b163:
        RestoreBackupDirectories(this);
        if ((char)local_4bc == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to run cmake:");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,(string *)&cmakeFailedOuput);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x315,_cmCTestLog_msg_3,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          iVar9 = 10;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to run ctest:");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"command: ");
          poVar6 = std::operator<<(poVar6,(string *)&command);
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"output: ");
          poVar6 = std::operator<<(poVar6,(string *)&output);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x31b,_cmCTestLog_msg_3,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          if (bVar3 == false) {
            iVar9 = 0xb;
          }
          else {
            iVar9 = retVal * 100;
          }
        }
LAB_0048b318:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ctestCommands);
        std::__cxx11::string::~string((string *)&cmakeFailedOuput);
      }
      else {
        RestoreBackupDirectories(this);
        iVar9 = 9;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,"Unable to create the binary directory:\n",filename);
      cmSystemTools::Error((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      RestoreBackupDirectories(this);
      iVar9 = 7;
    }
  }
LAB_0048b32c:
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&command);
  return iVar9;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationDashboard()
{
  // local variables
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // make sure the src directory is there, if it isn't then we might be able
  // to check it out from cvs
  retVal = this->CheckOutSourceDir();
  if (retVal) {
    return retVal;
  }

  // backup the dirs if requested
  retVal = this->BackupDirectories();
  if (retVal) {
    return retVal;
  }

  // clear the binary directory?
  if (this->EmptyBinDir) {
    if (!cmCTestScriptHandler::EmptyBinaryDirectory(this->BinaryDir)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem removing the binary directory" << std::endl);
    }
  }

  // make sure the binary directory exists if it isn't the srcdir
  if (!cmSystemTools::FileExists(this->BinaryDir) &&
      this->SourceDir != this->BinaryDir) {
    if (!cmSystemTools::MakeDirectory(this->BinaryDir)) {
      cmSystemTools::Error("Unable to create the binary directory:\n" +
                           this->BinaryDir);
      this->RestoreBackupDirectories();
      return 7;
    }
  }

  // if the binary directory and the source directory are the same,
  // and we are starting with an empty binary directory, then that means
  // we must check out the source tree
  if (this->EmptyBinDir && this->SourceDir == this->BinaryDir) {
    // make sure we have the required info
    if (this->CVSCheckOut.empty()) {
      cmSystemTools::Error(
        "You have specified the source and binary "
        "directories to be the same (an in source build). You have also "
        "specified that the binary directory is to be erased. This means "
        "that the source will have to be checked out from CVS. But you have "
        "not specified CTEST_CVS_CHECKOUT");
      return 8;
    }

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  // backup the dirs if requested
  retVal = this->PerformExtraUpdates();
  if (retVal) {
    return retVal;
  }

  // put the initial cache into the bin dir
  if (!this->InitialCache.empty()) {
    if (!cmCTestScriptHandler::WriteInitialCache(this->BinaryDir,
                                                 this->InitialCache)) {
      this->RestoreBackupDirectories();
      return 9;
    }
  }

  // do an initial cmake to setup the DartConfig file
  int cmakeFailed = 0;
  std::string cmakeFailedOuput;
  if (!this->CMakeCmd.empty()) {
    command = cmStrCat(this->CMakeCmd, " \"", this->SourceDir);
    output.clear();
    command += "\"";
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cmake command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    if (!this->CMOutFile.empty()) {
      std::string cmakeOutputFile = this->CMOutFile;
      if (!cmSystemTools::FileIsFullPath(cmakeOutputFile)) {
        cmakeOutputFile = this->BinaryDir + "/" + cmakeOutputFile;
      }

      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Write CMake output to file: " << cmakeOutputFile
                                                << std::endl);
      cmGeneratedFileStream fout(cmakeOutputFile);
      if (fout) {
        fout << output.c_str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Cannot open CMake output file: "
                     << cmakeOutputFile << " for writing" << std::endl);
      }
    }
    if (!res || retVal != 0) {
      // even if this fails continue to the next step
      cmakeFailed = 1;
      cmakeFailedOuput = output;
    }
  }

  // run ctest, it may be more than one command in here
  std::vector<std::string> ctestCommands = cmExpandedList(this->CTestCmd);
  // for each variable/argument do a putenv
  for (std::string const& ctestCommand : ctestCommands) {
    command = ctestCommand;
    output.clear();
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run ctest command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    // did something critical fail in ctest
    if (!res || cmakeFailed || retVal & cmCTest::BUILD_ERRORS) {
      this->RestoreBackupDirectories();
      if (cmakeFailed) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unable to run cmake:" << std::endl
                                          << cmakeFailedOuput << std::endl);
        return 10;
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to run ctest:" << std::endl
                                        << "command: " << command << std::endl
                                        << "output: " << output << std::endl);
      if (!res) {
        return 11;
      }
      return retVal * 100;
    }
  }

  // if all was successful, delete the backup dirs to free up disk space
  if (this->Backup) {
    cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
  }

  return 0;
}